

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O0

int wally_addr_segwit_n_get_version
              (char *addr,size_t addr_len,char *addr_family,size_t addr_family_len,uint32_t flags,
              size_t *written)

{
  _Bool _Var1;
  int local_6c;
  uchar local_68 [4];
  int ret;
  uchar witness_program [42];
  size_t *written_local;
  uint32_t flags_local;
  size_t addr_family_len_local;
  char *addr_family_local;
  size_t addr_len_local;
  char *addr_local;
  
  unique0x10000057 = written;
  local_6c = wally_addr_segwit_n_to_bytes
                       (addr,addr_len,addr_family,addr_family_len,flags,local_68,0x2a,written);
  if (local_6c == 0) {
    _Var1 = script_is_op_n(local_68[0],true,stack0xffffffffffffffc8);
    if (!_Var1) {
      *stack0xffffffffffffffc8 = 0;
      local_6c = -2;
    }
  }
  return local_6c;
}

Assistant:

int wally_addr_segwit_n_get_version(const char *addr, size_t addr_len,
                                    const char *addr_family, size_t addr_family_len,
                                    uint32_t flags, size_t *written)
{
    unsigned char witness_program[WALLY_WITNESSSCRIPT_MAX_LEN];
    int ret = wally_addr_segwit_n_to_bytes(addr, addr_len, addr_family, addr_family_len,
                                           flags, witness_program, sizeof(witness_program),
                                           written);
    if (ret == WALLY_OK && !script_is_op_n(witness_program[0], true, written)) {
        *written = 0;
        ret = WALLY_EINVAL;
    }
    return ret;
}